

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int nng_stream_dialer_alloc_url(nng_stream_dialer **dp,nng_url *url)

{
  char *__s2;
  long lVar1;
  int iVar2;
  anon_struct_24_3_2af8b803 *paVar3;
  long lVar4;
  
  __s2 = url->u_scheme;
  iVar2 = strcmp("ipc",__s2);
  if (iVar2 == 0) {
    paVar3 = stream_drivers;
  }
  else {
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      if (lVar4 + 0x18 == 0x150) {
        return 9;
      }
      iVar2 = strcmp(*(char **)((long)&stream_drivers[1].scheme + lVar4),__s2);
      lVar1 = lVar4 + 0x18;
    } while (iVar2 != 0);
    paVar3 = (anon_struct_24_3_2af8b803 *)(lVar4 + 0x1551f8);
  }
  iVar2 = (*paVar3->dialer_alloc)(dp,url);
  return iVar2;
}

Assistant:

int
nng_stream_dialer_alloc_url(nng_stream_dialer **dp, const nng_url *url)
{
	for (int i = 0; stream_drivers[i].scheme != NULL; i++) {
		if (strcmp(stream_drivers[i].scheme, url->u_scheme) == 0) {
			return (stream_drivers[i].dialer_alloc(dp, url));
		}
	}
	return (NNG_ENOTSUP);
}